

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O2

VRMatrix4 * MinVR::VRMatrix4::translation(VRMatrix4 *__return_storage_ptr__,VRVector3 *v)

{
  float local_48 [12];
  undefined8 local_18;
  float local_10;
  undefined4 local_c;
  
  local_10 = v->z;
  local_18._0_4_ = v->x;
  local_18._4_4_ = v->y;
  local_48[0] = 1.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  local_48[4] = 0.0;
  local_48[5] = 1.0;
  local_48[6] = 0.0;
  local_48[7] = 0.0;
  local_48[8] = 0.0;
  local_48[9] = 0.0;
  local_48[10] = 1.0;
  local_48[0xb] = 0.0;
  local_c = 0x3f800000;
  VRMatrix4(__return_storage_ptr__,local_48);
  return __return_storage_ptr__;
}

Assistant:

VRMatrix4 VRMatrix4::translation(const VRVector3& v) {
  return VRMatrix4::fromRowMajorElements(1, 0, 0, v[0],
                                         0, 1, 0, v[1],
                                         0, 0, 1, v[2],
                                         0, 0, 0, 1);
}